

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

int Abc_FrameIsFlagEnabled(char *pFlag)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = Cmd_FlagReadByName(s_GlobalFrame,pFlag);
  iVar1 = 0;
  if ((pcVar2 != (char *)0x0) &&
     ((*pcVar2 == '\0' || ((iVar1 = 0, *pcVar2 == '1' && (iVar1 = 0, pcVar2[1] == '\0')))))) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_FrameIsFlagEnabled( char * pFlag )
{
    char * pValue;
    // if flag is not defined, it is not enabled
    pValue = Abc_FrameReadFlag( pFlag );
    if ( pValue == NULL )
        return 0;
    // if flag is defined but value is not empty (no parameter) or "1", it is not enabled
    if ( strcmp(pValue, "") && strcmp(pValue, "1") )
        return 0;
    return 1;
}